

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::Run(Thread *this,int num_instructions,Ptr *out_trap)

{
  RunResult RVar1;
  int iVar2;
  Ptr func;
  RefPtr<wabt::interp::DefinedFunc> RStack_38;
  
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            (&RStack_38,this->store_,
             (Ref)(this->frames_).
                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].func.index);
  iVar2 = num_instructions + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 1) {
      RVar1 = Ok;
      break;
    }
    RVar1 = StepInternal(this,out_trap);
  } while (RVar1 == Ok);
  RefPtr<wabt::interp::DefinedFunc>::reset(&RStack_38);
  return RVar1;
}

Assistant:

RunResult Thread::Run(int num_instructions, Trap::Ptr* out_trap) {
  DefinedFunc::Ptr func{store_, frames_.back().func};
  for (; num_instructions > 0; --num_instructions) {
    auto result = StepInternal(out_trap);
    if (result != RunResult::Ok) {
      return result;
    }
  }
  return RunResult::Ok;
}